

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

Address * __thiscall
cfd::ConfidentialTransactionContext::GetTxOutPegoutAddress
          (Address *__return_storage_ptr__,ConfidentialTransactionContext *this,uint32_t index,
          NetType mainchain_network)

{
  pointer pCVar1;
  ulong uVar2;
  CfdException *this_00;
  ulong uVar3;
  Script local_58;
  
  pCVar1 = (this->super_ConfidentialTransaction).vout_.
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->super_ConfidentialTransaction).vout_.
                 super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) *
          -0x1084210842108421;
  uVar2 = (ulong)index;
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    core::AbstractTxOut::GetLockingScript(&local_58,&pCVar1[uVar2].super_AbstractTxOut);
    core::Address::GetPegoutAddress(__return_storage_ptr__,mainchain_network,&local_58);
    core::Script::~Script(&local_58);
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._vptr_Script =
       (_func_int **)
       ((long)&local_58.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"vout out_of_range error.","")
  ;
  core::CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)&local_58);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Address ConfidentialTransactionContext::GetTxOutPegoutAddress(
    uint32_t index, NetType mainchain_network) const {
  if (vout_.size() <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "vout out_of_range error.");
  }
  return Address::GetPegoutAddress(
      mainchain_network, vout_[index].GetLockingScript());
}